

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::DecimalNegateBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  byte bVar1;
  pointer pEVar2;
  reference other;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *in_RDI;
  uint8_t width;
  LogicalType *decimal_type;
  templated_unique_single_t bind_data;
  size_type in_stack_fffffffffffffea8;
  LogicalType *this;
  LogicalType *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  LogicalTypeId id;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this_00;
  LogicalType *in_stack_ffffffffffffff68;
  
  this_00._M_head_impl = (FunctionData *)in_RDI;
  make_uniq<duckdb::DecimalNegateBindData>();
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffeb0);
  this = &pEVar2->return_type;
  bVar1 = DecimalType::GetWidth(in_stack_fffffffffffffeb0);
  id = (LogicalTypeId)((ulong)in_RDI >> 0x38);
  if (bVar1 < 5) {
    LogicalType::LogicalType((LogicalType *)this_00._M_head_impl,id);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>(in_stack_ffffffffffffff68);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              this_00._M_head_impl,in_RDI);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0x124d6ae);
    LogicalType::~LogicalType((LogicalType *)0x124d6bb);
  }
  else if (bVar1 < 10) {
    LogicalType::LogicalType((LogicalType *)this_00._M_head_impl,id);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>(in_stack_ffffffffffffff68);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              this_00._M_head_impl,in_RDI);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0x124d764);
    LogicalType::~LogicalType((LogicalType *)0x124d771);
  }
  else if (bVar1 < 0x13) {
    LogicalType::LogicalType((LogicalType *)this_00._M_head_impl,id);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>(in_stack_ffffffffffffff68);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              this_00._M_head_impl,in_RDI);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0x124d7fb);
    LogicalType::~LogicalType((LogicalType *)0x124d805);
  }
  else {
    LogicalType::LogicalType((LogicalType *)this_00._M_head_impl,id);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>(in_stack_ffffffffffffff68);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              this_00._M_head_impl,in_RDI);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0x124d872);
    LogicalType::~LogicalType((LogicalType *)0x124d87c);
  }
  LogicalType::Verify(this);
  other = vector<duckdb::LogicalType,_true>::operator[]
                    ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffeb0,(size_type)this)
  ;
  LogicalType::operator=((LogicalType *)CONCAT17(bVar1,in_stack_fffffffffffffeb8),other);
  LogicalType::operator=((LogicalType *)CONCAT17(bVar1,in_stack_fffffffffffffeb8),other);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<std::default_delete<duckdb::FunctionData>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             other,this);
  unique_ptr<duckdb::DecimalNegateBindData,_std::default_delete<duckdb::DecimalNegateBindData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::DecimalNegateBindData,_std::default_delete<duckdb::DecimalNegateBindData>,_true>
                 *)0x124d925);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> DecimalNegateBind(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {

	auto bind_data = make_uniq<DecimalNegateBindData>();

	auto &decimal_type = arguments[0]->return_type;
	auto width = DecimalType::GetWidth(decimal_type);
	if (width <= Decimal::MAX_WIDTH_INT16) {
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::SMALLINT);
	} else if (width <= Decimal::MAX_WIDTH_INT32) {
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::INTEGER);
	} else if (width <= Decimal::MAX_WIDTH_INT64) {
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::BIGINT);
	} else {
		D_ASSERT(width <= Decimal::MAX_WIDTH_INT128);
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::HUGEINT);
	}
	decimal_type.Verify();
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = decimal_type;
	return nullptr;
}